

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::PrimitiveTypeHelper<3>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteVarint64(output,*ptr);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteInt64NoTag(Get<int64>(ptr), output);
  }